

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

void __thiscall
cmComputeLinkDepends::AddLinkEntries<cmLinkImplItem>
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *libs)

{
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  _Rb_tree_header *p_Var2;
  size_t __n;
  iterator __position;
  iterator __position_00;
  pointer pLVar3;
  cmGraphEdge cVar4;
  int iVar5;
  string *psVar6;
  _Rb_tree_node_base *p_Var7;
  cmLinkItem *item;
  pointer item_00;
  int dependee_index;
  map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  dependSets;
  _Rb_tree_color local_80;
  int local_7c;
  cmGraphEdge local_78;
  vector<int,std::allocator<int>> *local_70;
  long local_68;
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  item_00 = (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_7c = depender_index;
  p_Var7 = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (item_00 !=
      (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70 = (vector<int,std::allocator<int>> *)&this->OriginalEntries;
    local_68 = (ulong)(uint)depender_index * 3;
    do {
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
      __n = (item_00->super_cmLinkItem).super_string._M_string_length;
      if (__n == psVar6->_M_string_length) {
        if ((__n != 0) &&
           (iVar5 = bcmp((item_00->super_cmLinkItem).super_string._M_dataplus._M_p,
                         (psVar6->_M_dataplus)._M_p,__n), iVar5 != 0)) {
LAB_0042f681:
          local_80 = AddLinkEntry(this,&item_00->super_cmLinkItem);
          p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          if (local_7c < 0) {
            __position_00._M_current =
                 (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_70,__position_00,(int *)&local_80);
              p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              *__position_00._M_current = local_80;
              (this->OriginalEntries).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
          }
          else {
            this_00 = (vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)
                      ((long)&(((this->EntryConstraintGraph).
                                super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                              super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> +
                      local_68 * 8);
            local_78.Strong = true;
            __position._M_current =
                 (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            local_78.Dest = local_80;
            if (__position._M_current ==
                (this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                        (this_00,__position,&local_78);
              p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              cVar4.Strong = true;
              cVar4._5_3_ = local_78._5_3_;
              cVar4.Dest = local_80;
              *__position._M_current = cVar4;
              ppcVar1 = &(this_00->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
          }
          for (; (_Rb_tree_header *)p_Var7 != p_Var2;
              p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
            pLVar3 = (this->EntryList).
                     super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (((pLVar3[(int)local_80].Target == (cmGeneratorTarget *)0x0) &&
                (pLVar3[(int)local_80].IsFlag == false)) && (local_80 != p_Var7[1]._M_color)) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&p_Var7[1]._M_parent,(int *)&local_80);
            }
          }
          if ((this->InferredDependSets).
              super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)local_80] != (DependSetList *)0x0) {
            std::
            map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
            ::operator[]((map<int,_cmComputeLinkDepends::DependSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
                          *)&local_60,(key_type_conflict1 *)&local_80);
          }
        }
      }
      else if (__n != 0) goto LAB_0042f681;
      item_00 = item_00 + 1;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (item_00 !=
             (libs->super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  for (; (_Rb_tree_header *)p_Var7 != p_Var2;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>::
    push_back(&(this->InferredDependSets).
               super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)p_Var7[1]._M_color]->
               super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ,(value_type *)&p_Var7[1]._M_parent);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_cmComputeLinkDepends::DependSet>,_std::_Select1st<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::DependSet>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmComputeLinkDepends::AddLinkEntries(int depender_index,
                                          std::vector<T> const& libs)
{
  // Track inferred dependency sets implied by this list.
  std::map<int, DependSet> dependSets;

  // Loop over the libraries linked directly by the depender.
  for (typename std::vector<T>::const_iterator li = libs.begin();
       li != libs.end(); ++li) {
    // Skip entries that will resolve to the target getting linked or
    // are empty.
    cmLinkItem const& item = *li;
    if (item == this->Target->GetName() || item.empty()) {
      continue;
    }

    // Add a link entry for this item.
    int dependee_index = this->AddLinkEntry(*li);

    // The dependee must come after the depender.
    if (depender_index >= 0) {
      this->EntryConstraintGraph[depender_index].push_back(dependee_index);
    } else {
      // This is a direct dependency of the target being linked.
      this->OriginalEntries.push_back(dependee_index);
    }

    // Update the inferred dependencies for earlier items.
    for (std::map<int, DependSet>::iterator dsi = dependSets.begin();
         dsi != dependSets.end(); ++dsi) {
      // Add this item to the inferred dependencies of other items.
      // Target items are never inferred dependees because unknown
      // items are outside libraries that should not be depending on
      // targets.
      if (!this->EntryList[dependee_index].Target &&
          !this->EntryList[dependee_index].IsFlag &&
          dependee_index != dsi->first) {
        dsi->second.insert(dependee_index);
      }
    }

    // If this item needs to have dependencies inferred, do so.
    if (this->InferredDependSets[dependee_index]) {
      // Make sure an entry exists to hold the set for the item.
      dependSets[dependee_index];
    }
  }

  // Store the inferred dependency sets discovered for this list.
  for (std::map<int, DependSet>::iterator dsi = dependSets.begin();
       dsi != dependSets.end(); ++dsi) {
    this->InferredDependSets[dsi->first]->push_back(dsi->second);
  }
}